

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.h
# Opt level: O2

void __thiscall basist::basisu_transcoder_state::clear(basisu_transcoder_state *this)

{
  long lVar1;
  vector<unsigned_int> (*pavVar2) [16];
  uint32_t i;
  long lVar3;
  
  pavVar2 = this->m_prev_frame_indices;
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    basisu::vector<basist::basisu_transcoder_state::block_preds>::clear
              (this->m_block_endpoint_preds + lVar3);
    for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 0x10) {
      basisu::vector<unsigned_int>::clear
                ((vector<unsigned_int> *)((long)&(*pavVar2)[0].m_p + lVar1));
    }
    pavVar2 = pavVar2 + 1;
  }
  return;
}

Assistant:

void clear()
		{
			for (uint32_t i = 0; i < 2; i++)
			{
				m_block_endpoint_preds[i].clear();

				for (uint32_t j = 0; j < cMaxPrevFrameLevels; j++)
					m_prev_frame_indices[i][j].clear();
			}
		}